

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O0

amqp_socket_t * amqp_ssl_socket_new(amqp_connection_state_t state)

{
  int iVar1;
  amqp_socket_t *paVar2;
  SSL_METHOD *meth;
  SSL_CTX *pSVar3;
  undefined8 in_RDI;
  int status;
  amqp_ssl_socket_t *self;
  amqp_socket_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  amqp_socket_t *in_stack_fffffffffffffff8;
  
  paVar2 = (amqp_socket_t *)calloc(1,0x30);
  if (paVar2 != (amqp_socket_t *)0x0) {
    *(undefined4 *)&paVar2[2].klass = 0xffffffff;
    paVar2->klass = &amqp_ssl_socket_class;
    *(undefined4 *)&paVar2[4].klass = 1;
    *(undefined4 *)((long)&paVar2[4].klass + 4) = 1;
    iVar1 = initialize_ssl_and_increment_connections();
    if (iVar1 == 0) {
      meth = (SSL_METHOD *)TLS_client_method();
      pSVar3 = SSL_CTX_new(meth);
      paVar2[1].klass = (amqp_socket_class_t *)pSVar3;
      if ((paVar2[1].klass != (amqp_socket_class_t *)0x0) &&
         (iVar1 = amqp_ssl_socket_set_ssl_versions
                            (in_stack_fffffffffffffff8,(amqp_tls_version_t)((ulong)in_RDI >> 0x20),
                             (amqp_tls_version_t)in_RDI), iVar1 == 0)) {
        SSL_CTX_ctrl((SSL_CTX *)paVar2[1].klass,0x21,1,(void *)0x0);
        SSL_CTX_ctrl((SSL_CTX *)paVar2[1].klass,0x4e,4,(void *)0x0);
        amqp_set_socket((amqp_connection_state_t)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffd8);
        return paVar2;
      }
    }
    amqp_ssl_socket_delete((void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  }
  return (amqp_socket_t *)0x0;
}

Assistant:

amqp_socket_t *amqp_ssl_socket_new(amqp_connection_state_t state) {
  struct amqp_ssl_socket_t *self = calloc(1, sizeof(*self));
  int status;
  if (!self) {
    return NULL;
  }

  self->sockfd = -1;
  self->klass = &amqp_ssl_socket_class;
  self->verify_peer = 1;
  self->verify_hostname = 1;

  status = initialize_ssl_and_increment_connections();
  if (status) {
    goto error;
  }

  self->ctx = SSL_CTX_new(TLS_client_method());
  if (!self->ctx) {
    goto error;
  }
  status = amqp_ssl_socket_set_ssl_versions((amqp_socket_t *)self, AMQP_TLSv1_2,
                                            AMQP_TLSvLATEST);
  if (status != AMQP_STATUS_OK) {
    goto error;
  }

  SSL_CTX_set_mode(self->ctx, SSL_MODE_ENABLE_PARTIAL_WRITE);
  /* OpenSSL v1.1.1 turns this on by default, which makes the non-blocking
   * logic not behave as expected, so turn this back off */
  SSL_CTX_clear_mode(self->ctx, SSL_MODE_AUTO_RETRY);

  amqp_set_socket(state, (amqp_socket_t *)self);

  return (amqp_socket_t *)self;
error:
  amqp_ssl_socket_delete((amqp_socket_t *)self);
  return NULL;
}